

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

QXmlStreamNotationDeclarations * __thiscall
QXmlStreamReader::notationDeclarations(QXmlStreamReader *this)

{
  QXmlStreamReaderPrivate *pQVar1;
  qsizetype qVar2;
  QList<QXmlStreamNotationDeclaration> *in_RDI;
  QXmlStreamReaderPrivate *d;
  QXmlStreamReaderPrivate *in_stack_00000028;
  QList<QXmlStreamNotationDeclaration> *this_00;
  
  this_00 = in_RDI;
  pQVar1 = d_func((QXmlStreamReader *)0x649e38);
  qVar2 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::size
                    (&pQVar1->notationDeclarations);
  if (qVar2 != 0) {
    QXmlStreamReaderPrivate::resolveDtd(in_stack_00000028);
  }
  QList<QXmlStreamNotationDeclaration>::QList(this_00,in_RDI);
  return this_00;
}

Assistant:

QXmlStreamNotationDeclarations QXmlStreamReader::notationDeclarations() const
{
    Q_D(const QXmlStreamReader);
    if (d->notationDeclarations.size())
        const_cast<QXmlStreamReaderPrivate *>(d)->resolveDtd();
    return d->publicNotationDeclarations;
}